

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_NoHeapAllocationsTest_Test::~ArenaTest_NoHeapAllocationsTest_Test
          (ArenaTest_NoHeapAllocationsTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, NoHeapAllocationsTest) {
  if (internal::DebugHardenClearOneofMessageOnArena()) {
    GTEST_SKIP() << "debug hardening may cause heap allocation.";
  }

  // Allocate a large initial block to avoid mallocs during hooked test.
  std::vector<char> arena_block(128 * 1024);
  ArenaOptions options;
  options.initial_block = &arena_block[0];
  options.initial_block_size = arena_block.size();
  Arena arena(options);

  {
    // We need to call Arena::Create before NoHeapChecker because the ArenaDtor
    // allocates a new cleanup chunk.
    TestAllTypes* message = Arena::Create<TestAllTypes>(&arena);


    FillArenaAwareFields(message);
  }

  arena.Reset();
}